

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O0

void __thiscall FrozenCleanupCheck::~FrozenCleanupCheck(FrozenCleanupCheck *this)

{
  byte *in_RDI;
  long in_FS_OFFSET;
  memory_order __b;
  unique_lock<std::mutex> l;
  __memory_order_modifier in_stack_ffffffffffffff98;
  memory_order in_stack_ffffffffffffff9c;
  mutex_type *in_stack_ffffffffffffffa0;
  undefined1 *puVar1;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*in_RDI & 1) != 0) {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffa0);
    std::operator&(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    nFrozen.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
    puVar1 = cv;
    std::condition_variable::notify_one();
    std::condition_variable::wait<FrozenCleanupCheck::~FrozenCleanupCheck()::_lambda()_1_>
              ((condition_variable *)puVar1,local_18);
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

~FrozenCleanupCheck()
    {
        if (should_freeze) {
            std::unique_lock<std::mutex> l(m);
            nFrozen.store(1, std::memory_order_relaxed);
            cv.notify_one();
            cv.wait(l, []{ return nFrozen.load(std::memory_order_relaxed) == 0;});
        }
    }